

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRef.c
# Opt level: O3

void Rnm_ManJustify_rec(Rnm_Man_t *p,Gia_Obj_t *pObj,int f,Vec_Int_t *vSelect)

{
  Rnm_Obj_t RVar1;
  Rnm_Obj_t RVar2;
  Rnm_Obj_t *pRVar3;
  Gia_Man_t *p_00;
  Rnm_Obj_t *pRVar4;
  Rnm_Obj_t *pRVar5;
  ulong uVar6;
  Gia_Obj_t *pGVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint *puVar11;
  bool bVar12;
  
  uVar10 = pObj->Value;
  if ((~*(ulong *)pObj & 0x1fffffff1fffffff) == 0 || uVar10 != 0) {
    puVar11 = &pObj->Value;
    do {
      while( true ) {
        if (p->nObjsFrame <= (int)uVar10) goto LAB_0061c4d7;
        if ((f < 0) || (p->pCex->iFrame < f)) goto LAB_0061c4b8;
        iVar8 = p->nObjsFrame * f;
        pRVar3 = p->pObjs;
        if (((uint)pRVar3[(long)iVar8 + (ulong)uVar10] & 2) != 0) {
          return;
        }
        if (p->fPropFanout == 0) {
          pRVar3[(long)iVar8 + (ulong)uVar10] =
               (Rnm_Obj_t)((uint)pRVar3[(long)iVar8 + (ulong)uVar10] | 2);
          uVar9 = *puVar11;
          if (((~*(ulong *)pObj & 0x1fffffff1fffffff) != 0) && (uVar9 == 0)) goto LAB_0061c3b0;
          if (p->nObjsFrame <= (int)uVar9) goto LAB_0061c4d7;
          if (p->pCex->iFrame < 0) goto LAB_0061c4b8;
          RVar1 = p->pObjs[uVar9];
          if (((uint)RVar1 & 4) == 0) {
            p->pObjs[uVar9] = (Rnm_Obj_t)((uint)RVar1 | 4);
            p->nVisited = p->nVisited + 1;
          }
        }
        else {
          Rnm_ManJustifyPropFanout_rec(p,pObj,f,vSelect);
        }
        if (((uint)pRVar3[(long)iVar8 + (ulong)uVar10] & 8) != 0) {
          if (((uint)pRVar3[(long)iVar8 + (ulong)uVar10] & 0xffffff0) == 0) {
            __assert_fail("(int)pRnm->Prio > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absRef.c"
                          ,0x21f,
                          "void Rnm_ManJustify_rec(Rnm_Man_t *, Gia_Obj_t *, int, Vec_Int_t *)");
          }
          if (p->fPropFanout == 0) {
            pGVar7 = p->pGia->pObjs;
            if ((pGVar7 <= pObj) && (pObj < pGVar7 + p->pGia->nObjs)) {
              Vec_IntPush(vSelect,(int)((ulong)((long)pObj - (long)pGVar7) >> 2) * -0x55555555);
              return;
            }
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          iVar8 = p->pCex->iFrame;
          if (iVar8 < 0) {
            return;
          }
          goto LAB_0061c3f2;
        }
        pGVar7 = *(Gia_Obj_t **)pObj;
        uVar9 = (uint)pGVar7;
        if ((~uVar9 & 0x9fffffff) == 0) break;
        if ((~(ulong)pGVar7 & 0x1fffffff1fffffff) == 0) {
          return;
        }
        if (((int)uVar9 < 0) || ((uVar9 & 0x1fffffff) == 0x1fffffff)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absRef.c"
                        ,0x25d,"void Rnm_ManJustify_rec(Rnm_Man_t *, Gia_Obj_t *, int, Vec_Int_t *)"
                       );
        }
        pRVar4 = Rnm_ManObj(p,pObj + -(ulong)(uVar9 & 0x1fffffff),f);
        pRVar5 = Rnm_ManObj(p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff),f);
        RVar1 = *pRVar4;
        if (((uint)pRVar3[(long)iVar8 + (ulong)uVar10] & 1) == 0) {
          uVar6 = *(ulong *)pObj;
          RVar2 = *pRVar5;
          uVar10 = (uint)(uVar6 >> 0x3d) ^ (uint)RVar2;
          if ((((uint)(uVar6 >> 0x1d) & 7 ^ (uint)RVar1) & 1) == 0) {
            if ((uVar10 & 1) == 0) {
              uVar10 = (uint)RVar1 >> 4 & 0xffffff;
              uVar9 = (uint)RVar2 >> 4 & 0xffffff;
              if (uVar9 < uVar10) {
                if (uVar9 == 0) {
                  return;
                }
                goto LAB_0061c2ba;
              }
            }
            else {
              uVar10 = (uint)RVar1 & 0xffffff0;
            }
            if (uVar10 == 0) {
              return;
            }
          }
          else {
            if ((uVar10 & 1) != 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absRef.c"
                            ,0x25a,
                            "void Rnm_ManJustify_rec(Rnm_Man_t *, Gia_Obj_t *, int, Vec_Int_t *)");
            }
            if (((uint)RVar2 & 0xffffff0) == 0) {
              return;
            }
LAB_0061c2ba:
            uVar6 = uVar6 >> 0x20;
          }
        }
        else {
          if (((uint)RVar1 & 0xffffff0) != 0) {
            Rnm_ManJustify_rec(p,pObj + -(ulong)((uint)*(undefined8 *)pObj & 0x1fffffff),f,vSelect);
          }
          if (((uint)*pRVar5 & 0xffffff0) == 0) {
            return;
          }
          uVar6 = (ulong)*(uint *)&pObj->field_0x4;
        }
        uVar6 = (ulong)((uint)uVar6 & 0x1fffffff);
        puVar11 = &pObj[-uVar6].Value;
        pObj = pObj + -uVar6;
        uVar10 = *puVar11;
        if ((~*(ulong *)pObj & 0x1fffffff1fffffff) != 0 && uVar10 == 0) goto LAB_0061c3b0;
      }
      bVar12 = f == 0;
      f = f + -1;
      if ((~(ulong)pGVar7 & 0x1fffffff1fffffff) == 0) {
        return;
      }
      p_00 = p->pGia;
      if ((int)((uint)((ulong)pGVar7 >> 0x20) & 0x1fffffff) < p_00->vCis->nSize - p_00->nRegs) {
        return;
      }
      if (bVar12) {
        return;
      }
      pGVar7 = Gia_ObjRoToRi(p_00,pGVar7);
      uVar6 = (ulong)((uint)*(undefined8 *)pGVar7 & 0x1fffffff);
      pObj = pGVar7 + -uVar6;
      puVar11 = &pGVar7[-uVar6].Value;
      uVar10 = *puVar11;
    } while ((~*(ulong *)pObj & 0x1fffffff1fffffff) == 0 || uVar10 != 0);
  }
LAB_0061c3b0:
  __assert_fail("Gia_ObjIsConst0(pObj) || pObj->Value",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absRef.h"
                ,0x5f,"Rnm_Obj_t *Rnm_ManObj(Rnm_Man_t *, Gia_Obj_t *, int)");
LAB_0061c3f2:
  uVar10 = *puVar11;
  if (((~*(ulong *)pObj & 0x1fffffff1fffffff) != 0) && (uVar10 == 0)) goto LAB_0061c3b0;
  if (p->nObjsFrame <= (int)uVar10) {
LAB_0061c4d7:
    __assert_fail("(int)pObj->Value < p->nObjsFrame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absRef.h"
                  ,0x60,"Rnm_Obj_t *Rnm_ManObj(Rnm_Man_t *, Gia_Obj_t *, int)");
  }
  if (p->pCex->iFrame < iVar8) {
LAB_0061c4b8:
    __assert_fail("f >= 0 && f <= p->pCex->iFrame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absRef.h"
                  ,0x61,"Rnm_Obj_t *Rnm_ManObj(Rnm_Man_t *, Gia_Obj_t *, int)");
  }
  if (((uint)p->pObjs[(long)(p->nObjsFrame * iVar8) + (ulong)uVar10] & 2) == 0) {
    Rnm_ManJustifyPropFanout_rec(p,pObj,iVar8,vSelect);
  }
  bVar12 = iVar8 < 1;
  iVar8 = iVar8 + -1;
  if (bVar12) {
    return;
  }
  goto LAB_0061c3f2;
}

Assistant:

void Rnm_ManJustify_rec( Rnm_Man_t * p, Gia_Obj_t * pObj, int f, Vec_Int_t * vSelect )
{ 
    Rnm_Obj_t * pRnm = Rnm_ManObj( p, pObj, f );
    int i;//, Id = Gia_ObjId(p->pGia, pObj);
    if ( pRnm->fVisit )
        return;
    if ( p->fPropFanout )
        Rnm_ManJustifyPropFanout_rec( p, pObj, f, vSelect );
    else
    {
        pRnm->fVisit = 1;
        if ( Rnm_ManObj( p, pObj, 0 )->fVisitJ == 0 )
        {
            Rnm_ManObj( p, pObj, 0 )->fVisitJ = 1;
            p->nVisited++;
        }
    }
    if ( pRnm->fPPi )
    {
        assert( (int)pRnm->Prio > 0 );
        if ( p->fPropFanout )
        {
            for ( i = p->pCex->iFrame; i >= 0; i-- )
                if ( !Rnm_ManObj(p, pObj, i)->fVisit )
                    Rnm_ManJustifyPropFanout_rec( p, pObj, i, vSelect );
        }
        else
        {
            Vec_IntPush( vSelect, Gia_ObjId(p->pGia, pObj) );
//            for ( i = p->pCex->iFrame; i >= 0; i-- )
//                Rnm_ManObj(p, pObj, i)->fVisit = 1;
        }
        return;
    }
    if ( Gia_ObjIsPi(p->pGia, pObj) || Gia_ObjIsConst0(pObj) )
        return;
    if ( Gia_ObjIsRo(p->pGia, pObj) )
    {
        if ( f > 0 )
            Rnm_ManJustify_rec( p, Gia_ObjFanin0(Gia_ObjRoToRi(p->pGia, pObj)), f-1, vSelect );
        return;
    }
    if ( Gia_ObjIsAnd(pObj) )
    {
        Rnm_Obj_t * pRnm0 = Rnm_ManObj( p, Gia_ObjFanin0(pObj), f );
        Rnm_Obj_t * pRnm1 = Rnm_ManObj( p, Gia_ObjFanin1(pObj), f );
        if ( pRnm->Value == 1 )
        {
            if ( pRnm0->Prio > 0 )
                Rnm_ManJustify_rec( p, Gia_ObjFanin0(pObj), f, vSelect );
            if ( pRnm1->Prio > 0 )
                Rnm_ManJustify_rec( p, Gia_ObjFanin1(pObj), f, vSelect );
        }
        else // select one value
        {
            if ( (pRnm0->Value ^ Gia_ObjFaninC0(pObj)) == 0 && (pRnm1->Value ^ Gia_ObjFaninC1(pObj)) == 0 )
            {
                if ( pRnm0->Prio <= pRnm1->Prio ) // choice
                {
                    if ( pRnm0->Prio > 0 )
                        Rnm_ManJustify_rec( p, Gia_ObjFanin0(pObj), f, vSelect );
                }
                else
                {
                    if ( pRnm1->Prio > 0 )
                        Rnm_ManJustify_rec( p, Gia_ObjFanin1(pObj), f, vSelect );
                }
            }
            else if ( (pRnm0->Value ^ Gia_ObjFaninC0(pObj)) == 0 )
            {
                if ( pRnm0->Prio > 0 )
                    Rnm_ManJustify_rec( p, Gia_ObjFanin0(pObj), f, vSelect );
            }
            else if ( (pRnm1->Value ^ Gia_ObjFaninC1(pObj)) == 0 )
            {
                if ( pRnm1->Prio > 0 )
                    Rnm_ManJustify_rec( p, Gia_ObjFanin1(pObj), f, vSelect );
            }
            else assert( 0 );
        }
    }
    else assert( 0 );
}